

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

vector<CWire_*,_std::allocator<CWire_*>_> * __thiscall
CWire::AdjustByBoundary
          (vector<CWire_*,_std::allocator<CWire_*>_> *__return_storage_ptr__,CWire *this)

{
  pointer *pppCVar1;
  uint *puVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  CPoint *pCVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  CLayer *this_00;
  void *pvVar10;
  CLayer *pCVar11;
  CBoundary *pCVar12;
  CWire *pCVar13;
  int iVar14;
  CDesign *pCVar15;
  iterator iVar16;
  ulong uVar17;
  ulong uVar18;
  vector<CWire_*,_std::allocator<CWire_*>_> *AdjWire;
  CWire *pWire;
  CWire *local_68;
  CWire *local_60;
  void *local_58;
  uint local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  CNet *local_38;
  
  uVar9 = (this->super_CObject).m_iState;
  if ((uVar9 & 1) == 0) {
    __assert_fail("IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16e,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  if ((uVar9 & 4) == 0) {
    __assert_fail("IsLayerAssigned()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x16f,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 0;
  if (((this->super_CObject).m_iProp & 0x200) == 0) {
    iVar7 = CPoint::GetMDistance(this->m_pPointS,this->m_pPointE);
  }
  std::vector<CWire_*,_std::allocator<CWire_*>_>::reserve(__return_storage_ptr__,(long)iVar7);
  this_00 = GetLayer(this);
  pCVar15 = CObject::m_pDesign;
  if (this_00 == (CLayer *)0x0) {
    __assert_fail("pLayer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x175,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  local_38 = (CNet *)(this->super_CObject).m_pParent;
  if (local_38 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x177,"vector<CWire *> CWire::AdjustByBoundary()");
  }
  uVar9 = (this->super_CObject).m_iProp;
  local_60 = this;
  if ((uVar9 & 5) == 0) {
    if ((uVar9 & 10) == 0) {
      if ((uVar9 >> 9 & 1) == 0) {
        __assert_fail("IsPoint()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x21c,"vector<CWire *> CWire::AdjustByBoundary()");
      }
      iVar16._M_current =
           (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar16._M_current !=
          (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *iVar16._M_current = this;
        pppCVar1 = &(__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
        return __return_storage_ptr__;
      }
      local_68 = this;
      std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar16,&local_68);
      return __return_storage_ptr__;
    }
    iVar14 = (int)this->m_pPointE->m_iY;
    iVar7 = (int)this->m_pPointS->m_iY;
    local_50 = iVar14 - iVar7;
    if (local_50 == 0 || iVar14 < iVar7) {
      __assert_fail("iNumBoundary>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x1cd,"vector<CWire *> CWire::AdjustByBoundary()");
    }
    uVar18 = (ulong)local_50;
    pvVar10 = operator_new__(uVar18 * 4 + 4);
    local_48 = uVar18 + 1;
    uVar17 = 0;
    memset(pvVar10,0,uVar18 * 4);
    *(undefined4 *)((long)pvVar10 + uVar18 * 4) = 1;
    uVar9 = 0;
    pCVar15 = CObject::m_pDesign;
    local_58 = pvVar10;
    local_40 = uVar18;
    do {
      local_4c = uVar9;
      if ((pCVar15->super_CBBox).m_cMinZ < (pCVar15->super_CBBox).m_cMaxZ) {
        iVar7 = 0;
        do {
          iVar7 = iVar7 + 1;
          pCVar11 = CDesign::GetLayer(pCVar15,iVar7);
          iVar14 = CLayer::GetDirection(pCVar11);
          iVar8 = CLayer::GetDirection(this_00);
          if (iVar14 == iVar8) {
            pCVar12 = CLayer::GetBoundary(pCVar11,(int)local_60->m_pPointS->m_iX,
                                          (int)local_60->m_pPointS->m_iY + (int)uVar17);
            uVar9 = CBoundary::IsFound(pCVar12,local_38);
            puVar2 = (uint *)((long)local_58 + uVar17 * 4);
            *puVar2 = *puVar2 | uVar9;
          }
          pCVar15 = CObject::m_pDesign;
        } while (iVar7 < (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
                         (int)(CObject::m_pDesign->super_CBBox).m_cMinZ);
      }
      pvVar10 = local_58;
      uVar9 = local_4c + *(int *)((long)local_58 + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_40);
    if (uVar9 != 0) {
      if (uVar9 == local_50) {
        if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("AdjWire.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x1ec,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        (local_60->super_CObject).m_pParent = (CObject *)0x0;
        Delete(local_60);
      }
      else {
        pCVar6 = local_60->m_pPointS;
        sVar4 = pCVar6->m_iY;
        sVar5 = pCVar6->m_iX;
        cVar3 = pCVar6->m_cZ;
        uVar17 = 0xffffffff;
        uVar18 = 0;
        do {
          iVar7 = (int)uVar17;
          if (*(int *)((long)local_58 + uVar18 * 4) == 0) {
            if (iVar7 < 0) {
              uVar17 = uVar18 & 0xffffffff;
            }
          }
          else if (-1 < iVar7) {
            if (uVar18 <= uVar17) {
              __assert_fail("iNSY<iNEY",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                            ,0x204,"vector<CWire *> CWire::AdjustByBoundary()");
            }
            pCVar13 = (CWire *)operator_new(0x50);
            CObject::CObject((CObject *)pCVar13);
            (pCVar13->super_CObject)._vptr_CObject = (_func_int **)&PTR__CWire_0018ad48;
            pCVar13->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pCVar13->m_pPointE = (CPoint *)0x0;
            pCVar13->m_pPointS = (CPoint *)0x0;
            local_68 = pCVar13;
            Initialize(pCVar13,(int)sVar5,iVar7 + sVar4,(int)cVar3,(int)sVar5,
                       (int)uVar18 + (int)sVar4,(int)cVar3);
            (pCVar13->super_CObject).m_pParent = (local_60->super_CObject).m_pParent;
            (pCVar13->super_CObject).m_iState = (local_60->super_CObject).m_iState;
            iVar16._M_current =
                 (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                        ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar16,
                         &local_68);
            }
            else {
              *iVar16._M_current = local_68;
              pppCVar1 = &(__return_storage_ptr__->
                          super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
            uVar17 = 0xffffffff;
          }
          uVar18 = uVar18 + 1;
        } while (local_48 != uVar18);
        (local_60->super_CObject).m_pParent = (CObject *)0x0;
        Delete(local_60);
        pvVar10 = local_58;
      }
      goto LAB_0011f36d;
    }
    local_68 = local_60;
    iVar16._M_current =
         (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar16._M_current ==
        (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar16,&local_68);
      goto LAB_0011f36d;
    }
  }
  else {
    iVar14 = (int)this->m_pPointE->m_iX;
    iVar7 = (int)this->m_pPointS->m_iX;
    local_50 = iVar14 - iVar7;
    if ((local_50 == 0 || iVar14 < iVar7) ||
       (((int)(CObject::m_pDesign->super_CBBox).m_iMaxX -
         (int)(CObject::m_pDesign->super_CBBox).m_iMinX < (int)local_50 &&
        ((int)(CObject::m_pDesign->super_CBBox).m_iMaxY -
         (int)(CObject::m_pDesign->super_CBBox).m_iMinY < (int)local_50)))) {
      __assert_fail("iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x17d,"vector<CWire *> CWire::AdjustByBoundary()");
    }
    uVar18 = (ulong)local_50;
    pvVar10 = operator_new__(uVar18 * 4 + 4);
    local_48 = uVar18 + 1;
    uVar17 = 0;
    memset(pvVar10,0,uVar18 * 4);
    *(undefined4 *)((long)pvVar10 + uVar18 * 4) = 1;
    uVar9 = 0;
    local_58 = pvVar10;
    local_40 = uVar18;
    do {
      local_4c = uVar9;
      if ((pCVar15->super_CBBox).m_cMinZ < (pCVar15->super_CBBox).m_cMaxZ) {
        iVar7 = 0;
        do {
          iVar7 = iVar7 + 1;
          pCVar11 = CDesign::GetLayer(pCVar15,iVar7);
          iVar14 = CLayer::GetDirection(pCVar11);
          iVar8 = CLayer::GetDirection(this_00);
          if (iVar14 == iVar8) {
            pCVar12 = CLayer::GetBoundary(pCVar11,(int)local_60->m_pPointS->m_iX + (int)uVar17,
                                          (int)local_60->m_pPointS->m_iY);
            uVar9 = CBoundary::IsFound(pCVar12,local_38);
            puVar2 = (uint *)((long)local_58 + uVar17 * 4);
            *puVar2 = *puVar2 | uVar9;
          }
          pCVar15 = CObject::m_pDesign;
        } while (iVar7 < (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
                         (int)(CObject::m_pDesign->super_CBBox).m_cMinZ);
      }
      pvVar10 = local_58;
      uVar9 = local_4c + *(int *)((long)local_58 + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_40);
    if (uVar9 != 0) {
      if (uVar9 == local_50) {
        if ((__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __assert_fail("AdjWire.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x19e,"vector<CWire *> CWire::AdjustByBoundary()");
        }
        (local_60->super_CObject).m_pParent = (CObject *)0x0;
        Delete(local_60);
      }
      else {
        pCVar6 = local_60->m_pPointS;
        sVar4 = pCVar6->m_iX;
        sVar5 = pCVar6->m_iY;
        cVar3 = pCVar6->m_cZ;
        uVar17 = 0xffffffff;
        uVar18 = 0;
        do {
          iVar7 = (int)uVar17;
          if (*(int *)((long)local_58 + uVar18 * 4) == 0) {
            if (iVar7 < 0) {
              uVar17 = uVar18 & 0xffffffff;
            }
          }
          else if (-1 < iVar7) {
            pCVar13 = (CWire *)operator_new(0x50);
            CObject::CObject((CObject *)pCVar13);
            (pCVar13->super_CObject)._vptr_CObject = (_func_int **)&PTR__CWire_0018ad48;
            pCVar13->m_pRoutedSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar13->m_SegmentList).
            super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pCVar13->m_pPointE = (CPoint *)0x0;
            pCVar13->m_pPointS = (CPoint *)0x0;
            local_68 = pCVar13;
            Initialize(pCVar13,iVar7 + sVar4,(int)sVar5,(int)cVar3,(int)uVar18 + (int)sVar4,
                       (int)sVar5,(int)cVar3);
            (pCVar13->super_CObject).m_pParent = (local_60->super_CObject).m_pParent;
            (pCVar13->super_CObject).m_iState = (local_60->super_CObject).m_iState;
            iVar16._M_current =
                 (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                        ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar16,
                         &local_68);
            }
            else {
              *iVar16._M_current = local_68;
              pppCVar1 = &(__return_storage_ptr__->
                          super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
            uVar17 = 0xffffffff;
          }
          uVar18 = uVar18 + 1;
        } while (local_48 != uVar18);
        (local_60->super_CObject).m_pParent = (CObject *)0x0;
        Delete(local_60);
        pvVar10 = local_58;
      }
      goto LAB_0011f36d;
    }
    local_68 = local_60;
    iVar16._M_current =
         (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar16._M_current ==
        (__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*>
                ((vector<CWire*,std::allocator<CWire*>> *)__return_storage_ptr__,iVar16,&local_68);
      goto LAB_0011f36d;
    }
  }
  *iVar16._M_current = local_60;
  pppCVar1 = &(__return_storage_ptr__->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  *pppCVar1 = *pppCVar1 + 1;
  pvVar10 = local_58;
  local_68 = local_60;
LAB_0011f36d:
  operator_delete__(pvVar10);
  return __return_storage_ptr__;
}

Assistant:

vector<CWire*> CWire::AdjustByBoundary()
{
	assert(IsRouted());
	assert(IsLayerAssigned());

	vector<CWire*>		AdjWire;
	AdjWire.reserve(GetLength());

	CLayer*	pLayer		=	GetLayer();
	assert(pLayer);
	CNet*	pNet		=	GetParent();
	assert(pNet);

	int	iNumBoundary	=	0;
	if(IsHorizontal())
	{
		iNumBoundary			=	m_pPointE->X()-m_pPointS->X();
		assert(iNumBoundary>0&&(iNumBoundary<=GetDesign()->W()||iNumBoundary<=GetDesign()->H()));

		int*	pBoundary		=	new	int[iNumBoundary+1];
		assert(pBoundary);

		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(i+m_pPointS->X(),m_pPointS->Y())->IsFound(pNet);	
				}
			}

			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSX		=	m_pPointS->X();
			int	iEX		=	m_pPointE->X();
			int	iY		=	m_pPointS->Y();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSX	=	iSX+iLast;
						int	iNEX	=	iSX+i;
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iNSX,iY,iNEX,iY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;
					}
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else if(IsVertical())
	{
		iNumBoundary	=	m_pPointE->Y()-m_pPointS->Y();
		assert(iNumBoundary>0);

		int*	pBoundary		=	new	int[iNumBoundary+1];
		memset(pBoundary,0x00,iNumBoundary*sizeof(int));
		pBoundary[iNumBoundary]	=	1;	// mark as the last element [7/5/2006 thyeros]
		assert(pBoundary);

		int	iSum	=	0;
		int	i,j;
		for (i=0;i<iNumBoundary;++i)
		{
			for (j=1;j<=GetDesign()->T();++j)
			{
				CLayer*	pCurLayer	=	GetDesign()->GetLayer(j);

				if(pCurLayer->GetDirection()==pLayer->GetDirection())
				{
					pBoundary[i]	|=	pCurLayer->GetBoundary(m_pPointS->X(),i+m_pPointS->Y())->IsFound(pNet);	
				}
			}
			iSum	+=	pBoundary[i];
		}

		if(iSum==0)
		{	
			// whole wire is needed [7/5/2006 thyeros]
			AdjWire.push_back(this);
		}
		else if(iSum==iNumBoundary)
		{
			// already wires are there, discard this wire [7/5/2006 thyeros]
			assert(AdjWire.empty());

			m_pParent	=	NULL;
			Delete();//delete	this;
		}
		else
		{
			// partially needed [7/5/2006 thyeros]
			int	iSY		=	m_pPointS->Y();
			int	iEY		=	m_pPointE->Y();
			int	iX		=	m_pPointS->X();
			int	iZ		=	m_pPointS->Z();

			int	iLast	=	-1;
			for (i=0;i<iNumBoundary+1;++i)
			{
				if(pBoundary[i])
				{
					if(iLast>=0)
					{
						// create wire between iLast and i [7/5/2006 thyeros]
						int	iNSY	=	iSY+iLast;
						int	iNEY	=	iSY+i;
						
						assert(iNSY<iNEY);
						
						CWire*	pWire	=	new CWire;
						pWire->Initialize(iX,iNSY,iX,iNEY,iZ,this);
						
						AdjWire.push_back(pWire);
						
						iLast	=	-1;	
					}				
				}
				else
				{
					if(iLast<0)		iLast	=	i;
				}
			}

			m_pParent	=	NULL;
			Delete();//delete	this;
		}

		SAFE_DELA(pBoundary);
	}
	else
	{
		assert(IsPoint());
		AdjWire.push_back(this);
	}

	return	AdjWire;
}